

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  double dVar1;
  uint64 uVar2;
  int64 iVar3;
  uint uVar4;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1d1f);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
            (&(this->name_).super_RepeatedPtrFieldBase,&(from->name_).super_RepeatedPtrFieldBase);
  uVar4 = from->_has_bits_[0];
  if ((uVar4 & 0x1fe) != 0) {
    if ((uVar4 & 2) != 0) {
      set_identifier_value(this,from->identifier_value_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 4) != 0) {
      uVar2 = from->positive_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->positive_int_value_ = uVar2;
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 8) != 0) {
      iVar3 = from->negative_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->negative_int_value_ = iVar3;
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 0x10) != 0) {
      dVar1 = from->double_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      this->double_value_ = dVar1;
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 0x20) != 0) {
      set_string_value(this,from->string_value_);
      uVar4 = from->_has_bits_[0];
    }
    if ((uVar4 & 0x40) != 0) {
      set_aggregate_value(this,from->aggregate_value_);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
  GOOGLE_CHECK_NE(&from, this);
  name_.MergeFrom(from.name_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_identifier_value()) {
      set_identifier_value(from.identifier_value());
    }
    if (from.has_positive_int_value()) {
      set_positive_int_value(from.positive_int_value());
    }
    if (from.has_negative_int_value()) {
      set_negative_int_value(from.negative_int_value());
    }
    if (from.has_double_value()) {
      set_double_value(from.double_value());
    }
    if (from.has_string_value()) {
      set_string_value(from.string_value());
    }
    if (from.has_aggregate_value()) {
      set_aggregate_value(from.aggregate_value());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}